

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O0

void cmime_part_free(CMimePart_T *part)

{
  CMimePart_T *part_local;
  
  if (part != (CMimePart_T *)0x0) {
    cmime_list_free(part->headers);
    if (part->content != (char *)0x0) {
      free(part->content);
    }
    if (part->boundary != (char *)0x0) {
      free(part->boundary);
    }
    if (part->parent_boundary != (char *)0x0) {
      free(part->parent_boundary);
    }
    if (part->postface != (char *)0x0) {
      free(part->postface);
    }
    free(part);
    return;
  }
  __assert_fail("part",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                ,0x58,"void cmime_part_free(CMimePart_T *)");
}

Assistant:

void cmime_part_free(CMimePart_T *part) {
    assert(part);
    
    cmime_list_free(part->headers);
    
    if (part->content != NULL)
        free(part->content);
    
    if (part->boundary != NULL)
        free(part->boundary);

    if (part->parent_boundary != NULL)
        free(part->parent_boundary);

    if (part->postface != NULL)
        free(part->postface);
        
    free(part);
}